

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void conversion(void)

{
  SqStack P;
  SqStack S;
  long lVar1;
  long lVar2;
  undefined4 uStack_60;
  int N;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  SqStack local_38;
  
  S.base._4_4_ = N;
  S.base._0_4_ = uStack_60;
  S.top._0_4_ = local_58;
  S.top._4_4_ = uStack_54;
  S.stacksize = uStack_50;
  S._20_4_ = uStack_4c;
  InitStack(S);
  local_48 = local_38.stacksize;
  uStack_44 = local_38._20_4_;
  local_58 = local_38.base._0_4_;
  uStack_54 = local_38.base._4_4_;
  uStack_50 = local_38.top._0_4_;
  uStack_4c = local_38.top._4_4_;
  __isoc99_scanf("%d",&N);
  for (; N != 0; N = N / 8) {
    P.base._4_4_ = uStack_54;
    P.base._0_4_ = local_58;
    P.top._4_4_ = uStack_4c;
    P.top._0_4_ = uStack_50;
    P.stacksize = local_48;
    P._20_4_ = uStack_44;
    Push(&local_38,P,N % 8);
    local_48 = local_38.stacksize;
    uStack_44 = local_38._20_4_;
    local_58 = local_38.base._0_4_;
    uStack_54 = local_38.base._4_4_;
    uStack_50 = local_38.top._0_4_;
    uStack_4c = local_38.top._4_4_;
  }
  lVar1 = CONCAT44(uStack_54,local_58);
  for (lVar2 = CONCAT44(uStack_4c,uStack_50); lVar2 != lVar1; lVar2 = lVar2 + -4) {
    printf("%d",(ulong)*(uint *)(lVar2 + -4));
  }
  return;
}

Assistant:

void conversion(){
    int N;  //十进制整数
    SqStack S;
    S = InitStack(S);   //构造空栈
    scanf("%d",&N);
    while(N){
        S = Push(S,N % 8);
        N = N / 8;
    }
    while(S.top != S.base){
        printf("%d",*--S.top);
    }
}